

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_-1,_1,_true>_>,_3,_0>
       ::run(redux_evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>_>
             *mat,scalar_sum_op<double,_double> *func)

{
  double *pdVar1;
  long lVar2;
  Scalar *pSVar3;
  long lVar4;
  Scalar *pSVar5;
  Index index;
  long lVar6;
  long lVar7;
  long lVar8;
  Scalar SVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  lVar2 = (mat->m_xpr->
          super_BlockImpl<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true,_Eigen::Dense>
          ).
          super_BlockImpl_dense<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true,_false>
          .m_blockRows.m_value;
  lVar7 = 4;
  pSVar3 = (mat->m_evaluator).
           super_block_evaluator<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true,_false>
           .
           super_unary_evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>,_Eigen::internal::IndexBased,_double>
           .m_argImpl.
           super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           .
           super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
           .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.
           m_data;
  lVar4 = (mat->m_evaluator).
          super_block_evaluator<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true,_false>
          .
          super_unary_evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>,_Eigen::internal::IndexBased,_double>
          .m_linear_offset.m_value;
  if (lVar2 + 1U < 3) {
    pdVar1 = (mat->m_evaluator).
             super_block_evaluator<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true,_false>
             .
             super_unary_evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>,_Eigen::internal::IndexBased,_double>
             .m_argImpl.
             super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             .
             super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
             .m_rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.
             m_data + lVar4;
    SVar9 = pSVar3[lVar4] * *pdVar1;
    for (lVar7 = 1; lVar7 < lVar2; lVar7 = lVar7 + 1) {
      SVar9 = SVar9 + (pSVar3 + lVar4)[lVar7] * pdVar1[lVar7];
    }
  }
  else {
    lVar6 = (lVar2 / 2) * 2;
    pSVar5 = (mat->m_evaluator).
             super_block_evaluator<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true,_false>
             .
             super_unary_evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>,_Eigen::internal::IndexBased,_double>
             .m_argImpl.
             super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             .
             super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
             .m_rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.
             m_data;
    pdVar1 = pSVar5 + lVar4;
    dVar12 = *pdVar1 * pSVar3[lVar4];
    dVar13 = pdVar1[1] * (pSVar3 + lVar4)[1];
    if (3 < lVar2) {
      lVar8 = (lVar2 / 4) * 4;
      dVar10 = pSVar5[lVar4 + 2] * pSVar3[lVar4 + 2];
      dVar11 = (pSVar5 + lVar4 + 2)[1] * pSVar3[lVar4 + 3];
      for (; lVar7 < lVar8; lVar7 = lVar7 + 4) {
        dVar12 = dVar12 + pdVar1[lVar7] * pSVar3[lVar4 + lVar7];
        dVar13 = dVar13 + (pdVar1 + lVar7)[1] * (pSVar3 + lVar4 + lVar7)[1];
        dVar10 = dVar10 + pdVar1[lVar7 + 2] * pSVar3[lVar4 + lVar7 + 2];
        dVar11 = dVar11 + (pdVar1 + lVar7 + 2)[1] * (pSVar3 + lVar4 + lVar7 + 2)[1];
      }
      dVar12 = dVar12 + dVar10;
      dVar13 = dVar13 + dVar11;
      if (lVar8 < lVar6) {
        dVar12 = dVar12 + pSVar5[lVar8 + lVar4] * pSVar3[lVar8 + lVar4];
        dVar13 = dVar13 + (pSVar5 + lVar8 + lVar4)[1] * (pSVar3 + lVar8 + lVar4)[1];
      }
    }
    SVar9 = dVar13 + dVar12;
    for (; lVar6 < lVar2; lVar6 = lVar6 + 1) {
      SVar9 = SVar9 + pSVar3[lVar4 + lVar6] * pdVar1[lVar6];
    }
  }
  return SVar9;
}

Assistant:

EIGEN_DEVICE_FUNC Index size() const { return m_xpr.size(); }